

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bit_vector.h
# Opt level: O2

void __thiscall
bsim::dynamic_bit_vector::dynamic_bit_vector(dynamic_bit_vector *this,int N_,string *str_raw)

{
  byte *pbVar1;
  char cVar2;
  uint uVar3;
  size_type sVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  string str;
  
  (this->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->N = N_;
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  lVar7 = 0;
  iVar6 = 0;
  do {
    sVar4 = str._M_string_length;
    if ((int)str_raw->_M_string_length <= lVar7) {
      uVar3 = this->N;
      if (iVar6 <= (int)uVar3) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&this->bits,(long)(int)(((int)uVar3 / 8 - (uint)((uVar3 & 7) == 0)) + 1));
        iVar6 = 0;
        for (uVar5 = sVar4 & 0xffffffff; 0 < (int)uVar5; uVar5 = uVar5 - 1) {
          set(this,iVar6,str._M_dataplus._M_p[uVar5 - 1] != '0');
          iVar6 = iVar6 + 1;
        }
        iVar6 = this->N;
        while ((int)sVar4 < iVar6) {
          iVar6 = iVar6 + -1;
          pbVar1 = (this->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start + iVar6 / 8;
          *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)iVar6 & 7));
        }
        std::__cxx11::string::~string((string *)&str);
        return;
      }
      __assert_fail("num_digits <= N",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/dynamic_bit_vector.h"
                    ,0x9c,
                    "bsim::dynamic_bit_vector::dynamic_bit_vector(const int, const std::string &)");
    }
    cVar2 = (str_raw->_M_dataplus)._M_p[lVar7];
    if ((int)cVar2 - 0x30U < 10) {
      std::__cxx11::string::push_back((char)&str);
      iVar6 = iVar6 + 1;
    }
    else if (cVar2 != '_') {
      __assert_fail("str_raw[i] == \'_\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/dynamic_bit_vector.h"
                    ,0x99,
                    "bsim::dynamic_bit_vector::dynamic_bit_vector(const int, const std::string &)");
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

dynamic_bit_vector(const int N_, const std::string& str_raw) : N(N_) {
      int num_digits = 0;
      std::string str;
      for (int i = 0; i < ((int) str_raw.size()); i++) {
	if (isdigit(str_raw[i])) {
	  num_digits++;
	  str += str_raw[i];
	} else {
	  assert(str_raw[i] == '_');
	}
      }
      assert(num_digits <= N);

      int len = str.size();      
      bits.resize(NUM_BYTES(N));
      for (int i = len - 1; i >= 0; i--) {
        unsigned char val = (str[i] == '0') ? 0 : 1;
        int ind = len - i - 1;
        set(ind, val);
      }
      for (int i = N-1; i>=len; i--) {
        set(i,0);
      }
    }